

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O3

void freenode234(node234_conflict *n)

{
  if (n != (node234_conflict *)0x0) {
    freenode234(n->kids[0]);
    freenode234(n->kids[1]);
    freenode234(n->kids[2]);
    freenode234(n->kids[3]);
    safefree(n);
    return;
  }
  return;
}

Assistant:

static void freenode234(node234 * n)
{
    if (!n)
        return;
    freenode234(n->kids[0]);
    freenode234(n->kids[1]);
    freenode234(n->kids[2]);
    freenode234(n->kids[3]);
    sfree(n);
}